

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_must(lysc_ctx *ctx,lysp_restr *must_p,lysc_must *must)

{
  void **ppvVar1;
  ly_ctx *ctx_00;
  char *__s;
  lysc_ext_instance *plVar2;
  LY_ERR LVar3;
  size_t value_len;
  long *plVar4;
  lysp_ext_instance *plVar5;
  lysp_ext_instance *plVar6;
  long lVar7;
  long lVar8;
  lysp_ext_instance *plVar9;
  void *pvVar10;
  LY_VALUE_FORMAT format;
  
  LVar3 = lyxp_expr_parse(ctx->ctx,(must_p->arg).str,0,'\x01',&must->cond);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  ctx_00 = ctx->ctx;
  __s = (must_p->arg).str;
  value_len = strlen(__s);
  LVar3 = lyplg_type_prefix_data_new
                    (ctx_00,__s,value_len,LY_VALUE_SCHEMA,(must_p->arg).mod,&format,&must->prefixes)
  ;
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  LVar3 = lydict_dup(ctx->ctx,must_p->eapptag,&must->eapptag);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  LVar3 = lydict_dup(ctx->ctx,must_p->emsg,&must->emsg);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  LVar3 = lydict_dup(ctx->ctx,must_p->dsc,&must->dsc);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  LVar3 = lydict_dup(ctx->ctx,must_p->ref,&must->ref);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  plVar9 = must_p->exts;
  if (plVar9 != (lysp_ext_instance *)0x0) {
    plVar2 = must->exts;
    if (plVar2 == (lysc_ext_instance *)0x0) {
      plVar4 = (long *)calloc(1,(long)plVar9[-1].exts * 0x48 + 8);
      if (plVar4 == (long *)0x0) goto LAB_00141fb1;
      lVar7 = 0;
      pvVar10 = (void *)0x0;
    }
    else {
      pvVar10 = plVar2[-1].compiled;
      plVar4 = (long *)realloc(&plVar2[-1].compiled,
                               ((long)&(plVar9[-1].exts)->name + (long)pvVar10 * 2) * 0x48 + 8);
      if (plVar4 == (long *)0x0) {
LAB_00141fb1:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_must");
        return LY_EMEM;
      }
      lVar7 = *plVar4;
    }
    must->exts = (lysc_ext_instance *)(plVar4 + 1);
    plVar9 = must_p->exts;
    if (plVar9 == (lysp_ext_instance *)0x0) {
      plVar5 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar5 = plVar9[-1].exts;
    }
    lVar8 = 0;
    memset(plVar4 + lVar7 * 9 + 1,0,((long)&plVar5->name + (long)pvVar10) * 0x48);
    plVar5 = (lysp_ext_instance *)0x0;
    while( true ) {
      if (plVar9 == (lysp_ext_instance *)0x0) {
        plVar6 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar6 = plVar9[-1].exts;
      }
      if (plVar6 <= plVar5) break;
      plVar2 = must->exts;
      pvVar10 = plVar2[-1].compiled;
      plVar2[-1].compiled = (void *)((long)pvVar10 + 1);
      LVar3 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar9->name + lVar8),
                              plVar2 + (long)pvVar10,must);
      if (LVar3 != LY_SUCCESS) {
        if (LVar3 != LY_ENOT) {
          return LVar3;
        }
        ppvVar1 = &must->exts[-1].compiled;
        *ppvVar1 = (void *)((long)*ppvVar1 + -1);
      }
      plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
      plVar9 = must_p->exts;
      lVar8 = lVar8 + 0x70;
    }
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_compile_must(struct lysc_ctx *ctx, const struct lysp_restr *must_p, struct lysc_must *must)
{
    LY_ERR ret = LY_SUCCESS;
    LY_VALUE_FORMAT format;

    LY_CHECK_RET(lyxp_expr_parse(ctx->ctx, must_p->arg.str, 0, 1, &must->cond));
    LY_CHECK_RET(lyplg_type_prefix_data_new(ctx->ctx, must_p->arg.str, strlen(must_p->arg.str),
            LY_VALUE_SCHEMA, must_p->arg.mod, &format, (void **)&must->prefixes));
    DUP_STRING_GOTO(ctx->ctx, must_p->eapptag, must->eapptag, ret, done);
    DUP_STRING_GOTO(ctx->ctx, must_p->emsg, must->emsg, ret, done);
    DUP_STRING_GOTO(ctx->ctx, must_p->dsc, must->dsc, ret, done);
    DUP_STRING_GOTO(ctx->ctx, must_p->ref, must->ref, ret, done);
    COMPILE_EXTS_GOTO(ctx, must_p->exts, must->exts, must, ret, done);

done:
    return ret;
}